

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O2

int sfp_calculate_cc_base(tcv_t *tcv)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = 0xfffffffc;
  if ((tcv != (tcv_t *)0x0) && (tcv->data != (void *)0x0)) {
    bVar1 = 0;
    for (lVar3 = 1; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      bVar1 = bVar1 + *(char *)((long)tcv->data + lVar3);
    }
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

int sfp_calculate_cc_base(tcv_t *tcv)
{
	int i;
	int sum = 0;

	if (tcv == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* The CC Base is the low order 8 bits of the sum of the contents of all
	 * bytes from 0x00 to 0x62 */
	for (i = FIRST_CC_BASE_ADDR; i <= LAST_CC_BASE_ADDR; i++)
		sum += ((sfp_data_t*)tcv->data)->a0[i];

	/* Return low order 8 bits only */
	return (sum & 0xff);
}